

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oop_interface.cpp
# Opt level: O0

void __thiscall
isotree::IsolationForest::fit
          (IsolationForest *this,double *numeric_data,size_t ncols_numeric,size_t nrows,
          int *categ_data,size_t ncols_categ,int *ncat,double *sample_weights,double *col_weights)

{
  pointer pvVar1;
  int iVar2;
  runtime_error *this_00;
  int in_ECX;
  IsoForest *in_RDI;
  uint64_t in_R9;
  uint uVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  double in_stack_00000018;
  int retcode;
  undefined4 in_stack_fffffffffffffc04;
  undefined4 in_stack_fffffffffffffc14;
  int in_stack_fffffffffffffc1c;
  IsolationForest *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined1 in_stack_fffffffffffffdc5;
  undefined1 in_stack_fffffffffffffdc6;
  undefined7 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffe24;
  double *ncols_numeric_00;
  ExtIsoForest *model_outputs_ext;
  int *in_stack_fffffffffffffe80;
  double *in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  CoefType in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  ScoringMetric in_stack_ffffffffffffff18;
  double *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffff38;
  double *in_stack_ffffffffffffff48;
  MissingAction in_stack_ffffffffffffff58;
  CategSplit in_stack_ffffffffffffff60;
  NewCategAction in_stack_ffffffffffffff68;
  Imputer *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  UseDepthImp in_stack_ffffffffffffff88;
  WeighImpRows in_stack_ffffffffffffff90;
  
  check_params(in_stack_fffffffffffffc80);
  override_previous_fit
            ((IsolationForest *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  if ((in_RDI->trees).
      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1) {
    model_outputs_ext = (ExtIsoForest *)&in_RDI[2].exp_avg_depth;
  }
  else {
    model_outputs_ext = (ExtIsoForest *)0x0;
  }
  if ((in_RDI->trees).
      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1) {
    ncols_numeric_00 = (double *)0x0;
  }
  else {
    ncols_numeric_00 = &in_RDI[3].exp_avg_depth;
  }
  pvVar1 = in_RDI[2].trees.
           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (byte)(char)in_RDI->scoring_metric & 1;
  uVar3 = *(byte *)((long)&in_RDI[2].trees.
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) & 1;
  iVar2 = fit_iforest(in_RDI,model_outputs_ext,(double *)model_outputs_ext,(size_t)ncols_numeric_00,
                      (int *)CONCAT44(CONCAT13(*(undefined1 *)
                                                ((long)&in_RDI[2].trees.
                                                                                                                
                                                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                + 5),(int3)in_stack_fffffffffffffe24),
                                      *(undefined4 *)
                                       &in_RDI[2].trees.
                                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage),
                      (size_t)in_RDI[2].trees.
                              super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,in_stack_fffffffffffffe80,
                      in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,
                      in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                      SUB81((ulong)pvVar1 >> 0x38,0),in_stack_fffffffffffffec0,
                      SUB81((ulong)pvVar1 >> 0x30,0),SUB81((ulong)pvVar1 >> 0x28,0),
                      in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
                      in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
                      SUB81((ulong)pvVar1 >> 0x20,0),SUB81((ulong)pvVar1 >> 0x18,0),
                      SUB81((ulong)pvVar1 >> 0x10,0),in_stack_ffffffffffffff18,
                      SUB81((ulong)pvVar1 >> 8,0),SUB81(pvVar1,0),in_stack_ffffffffffffff30,
                      in_stack_ffffffffffffff38,
                      SUB81((ulong)*(undefined8 *)&in_RDI[1].has_range_penalty >> 0x38,0),
                      in_stack_ffffffffffffff48,
                      SUB81((ulong)*(undefined8 *)&in_RDI[1].has_range_penalty >> 0x30,0),
                      (double)in_RDI[1].orig_sample_size,in_RDI[1].exp_avg_sep,
                      in_RDI[1].exp_avg_depth,*(double *)&in_RDI[1].missing_action,
                      *(double *)&in_RDI[1].new_cat_action,
                      (double)in_RDI[1].trees.
                              super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (double)CONCAT17(*(undefined1 *)
                                        ((long)&in_RDI[1].trees.
                                                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish + 1),
                                       in_stack_fffffffffffffdd0),in_stack_00000018,
                      in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                      *(bool *)&in_RDI[1].trees.
                                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,in_stack_ffffffffffffff78
                      ,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90
                      ,(bool)in_stack_fffffffffffffdc6,in_R9,(bool)in_stack_fffffffffffffdc5,in_ECX)
  ;
  if (iVar2 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc14,uVar4),(char *)in_stack_00000010,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc04,uVar3));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc14,uVar4),(char *)in_stack_00000010,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc04,uVar3));
    std::operator+(in_stack_00000010,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,uVar3));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc14,uVar4),(char *)in_stack_00000010,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc04,uVar3));
    std::operator+(in_stack_00000010,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,uVar3));
    std::__cxx11::to_string(in_stack_fffffffffffffc1c);
    std::operator+(in_stack_00000010,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,uVar3));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc14,uVar4),(char *)in_stack_00000010,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc04,uVar3));
    std::operator+(in_stack_00000010,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,uVar3));
    std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffff78);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined1 *)&in_RDI[6].missing_action = 1;
  return;
}

Assistant:

void IsolationForest::fit(double numeric_data[],   size_t ncols_numeric,  size_t nrows,
                          int    categ_data[],     size_t ncols_categ,    int ncat[],
                          double sample_weights[], double col_weights[])
{
    this->check_params();
    this->override_previous_fit();

    auto retcode = fit_iforest(
        (this->ndim == 1)? &this->model : nullptr,
        (this->ndim != 1)? &this->model_ext : nullptr,
        numeric_data,  ncols_numeric,
        categ_data, ncols_categ, ncat,
        (double*)nullptr, (int*)nullptr, (int*)nullptr,
        this->ndim, this->ntry, this->coef_type, this->coef_by_prop,
        sample_weights, this->with_replacement, this->weight_as_sample,
        nrows, this->sample_size, this->ntrees,
        this->max_depth, this->ncols_per_tree,
        this->limit_depth, this->penalize_range, this->standardize_data,
        this->scoring_metric, this->fast_bratio,
        false, (double*)nullptr,
        (double*)nullptr, true,
        col_weights, this->weigh_by_kurt,
        this->prob_pick_by_gain_pl,
        this->prob_pick_by_gain_avg,
        this->prob_pick_by_full_gain,
        this->prob_pick_by_dens,
        this->prob_pick_col_by_range,
        this->prob_pick_col_by_var,
        this->prob_pick_col_by_kurt,
        this->min_gain, this->missing_action,
        this->cat_split_type, this->new_cat_action,
        this->all_perm, this->build_imputer? &this->imputer : nullptr, this->min_imp_obs,
        this->depth_imp, this->weigh_imp_rows, false,
        this->random_seed, false, this->nthreads
    );
    if (retcode != EXIT_SUCCESS) unexpected_error();
    this->is_fitted = true;
}